

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_easy_api.cc
# Opt level: O2

bool __thiscall ModelBuilder::Check(ModelBuilder *this,NLSolution *sol)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  
  bVar2 = ApproxEqual(sol->obj_val_,this->obj_val_ref_);
  if (bVar2) {
    lVar1 = ((long)(sol->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(sol->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) + 1;
    do {
      lVar3 = lVar1;
      if (lVar3 == 1) {
        printf("MIQP 1: solution check ok, obj=%.17g.\n",sol->obj_val_);
        return true;
      }
      bVar2 = ApproxEqual((this->x_ref_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start[lVar3 + -2],
                          (sol->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar3 + -2]);
      lVar1 = lVar3 + -1;
    } while (bVar2);
    printf("MIQP 1: wrong x[%ld] (%.17g !~ %.17g)\n",
           (sol->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar3 + -2],
           (this->x_ref_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar3 + -2],lVar3 + -1);
  }
  else {
    printf("MIQP 1: wrong obj val (%.17g !~ %.17g)\n",sol->obj_val_,this->obj_val_ref_);
  }
  return false;
}

Assistant:

bool Check(mp::NLSolution sol) {
    if (!ApproxEqual(sol.obj_val_, obj_val_ref_)) {
      printf("MIQP 1: wrong obj val (%.17g !~ %.17g)\n",
             sol.obj_val_, obj_val_ref_);
      return false;
    }
    for (auto i=sol.x_.size(); i--; )
      if (!ApproxEqual(x_ref_[i], sol.x_[i])) {
        printf("MIQP 1: wrong x[%ld] (%.17g !~ %.17g)\n",
               i+1, sol.x_[i], x_ref_[i]);
        return false;
      }
    printf("MIQP 1: solution check ok, obj=%.17g.\n",
           sol.obj_val_);
    return true;
  }